

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallArgs.cpp
# Opt level: O0

void __thiscall CallArgs::~CallArgs(CallArgs *this)

{
  Variable *this_00;
  bool bVar1;
  reference ppVar2;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_Variable_*>_> local_18;
  iterator iter;
  CallArgs *this_local;
  
  iter._M_node = (_Base_ptr)this;
  std::_Rb_tree_iterator<std::pair<const_unsigned_int,_Variable_*>_>::_Rb_tree_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::
             map<unsigned_int,_Variable_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Variable_*>_>_>
             ::begin(&this->variables);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_Variable_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Variable_*>_>_>
         ::end(&this->variables);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_Variable_*>_>::operator*
                       (&local_18);
    this_00 = ppVar2->second;
    if (this_00 != (Variable *)0x0) {
      Variable::~Variable(this_00);
      operator_delete(this_00);
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_Variable_*>_>::operator++(&local_18,0);
  }
  std::
  map<unsigned_int,_Variable_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Variable_*>_>_>
  ::clear(&this->variables);
  std::
  map<unsigned_int,_Variable_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Variable_*>_>_>
  ::~map(&this->variables);
  return;
}

Assistant:

CallArgs::~CallArgs() {
	std::map<unsigned int, Variable*>::iterator iter;
	for (iter = this->variables.begin(); iter != this->variables.end(); iter++) {
		delete (*iter).second;
	}
	this->variables.clear();
}